

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void CostManagerClear(CostManager *manager)

{
  CostInterval *in_RDI;
  
  if (in_RDI != (CostInterval *)0x0) {
    WebPSafeFree((void *)0x19e8ae);
    WebPSafeFree((void *)0x19e8bb);
    DeleteIntervalList(manager,in_RDI);
    in_RDI->cost_ = 0.0;
    in_RDI->start_ = 0;
    DeleteIntervalList(manager,in_RDI);
    in_RDI[0x40b].previous_ = (CostInterval *)0x0;
    memset(in_RDI,0,0x8178);
    CostManagerInitFreeList(manager);
  }
  return;
}

Assistant:

static void CostManagerClear(CostManager* const manager) {
  if (manager == NULL) return;

  WebPSafeFree(manager->costs_);
  WebPSafeFree(manager->cache_intervals_);

  // Clear the interval lists.
  DeleteIntervalList(manager, manager->head_);
  manager->head_ = NULL;
  DeleteIntervalList(manager, manager->recycled_intervals_);
  manager->recycled_intervals_ = NULL;

  // Reset pointers, count_ and cache_intervals_size_.
  memset(manager, 0, sizeof(*manager));
  CostManagerInitFreeList(manager);
}